

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectSeq(Gia_Man_t *p,int *pPos,int nPos)

{
  int iVar1;
  int Id;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_01;
  ulong uVar2;
  ulong uVar3;
  
  p_00 = Vec_IntAlloc(100);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nPos;
  if (nPos < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      Gia_ManIncrementTravId(p);
      Gia_ObjSetTravIdCurrentId(p,0);
      p_01 = Vec_IntAlloc(1000);
      Vec_IntPush(p_01,0);
      for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        Id = Vec_IntEntry(p_00,iVar1);
        Gia_ManCollectSeq_rec(p,Id,p_00,p_01);
      }
      Vec_IntFree(p_00);
      return p_01;
    }
    if (p->vCos->nSize - p->nRegs <= pPos[uVar2]) break;
    pObj = Gia_ManCo(p,pPos[uVar2]);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(p_00,iVar1);
    uVar2 = uVar2 + 1;
  }
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Gia_ManCollectSeq( Gia_Man_t * p, int * pPos, int nPos )
{
    Vec_Int_t * vObjs, * vRoots;
    int i, iRoot;
    // collect roots
    vRoots = Vec_IntAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, pPos[i])) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    // collect objects
    vObjs = Vec_IntAlloc( 1000 );
    Vec_IntPush( vObjs, 0 );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectSeq_rec( p, iRoot, vRoots, vObjs );
    Vec_IntFree( vRoots );
    return vObjs;
}